

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_motion.c
# Opt level: O0

void av1_compute_feature_segmentation_map
               (uint8_t *segment_map,int width,int height,int *inliers,int num_inliers)

{
  long in_RCX;
  long lVar1;
  int in_EDX;
  int in_ESI;
  void *in_RDI;
  int in_R8D;
  uint8_t feat_count;
  int j;
  int i_1;
  int seg_y;
  int seg_x;
  int y;
  int x;
  int i;
  int seg_count;
  undefined4 local_3c;
  undefined4 local_38;
  undefined4 local_24;
  undefined4 local_20;
  
  local_20 = 0;
  memset(in_RDI,0,(long)in_ESI * (long)in_EDX);
  for (local_24 = 0; local_24 < in_R8D; local_24 = local_24 + 1) {
    lVar1 = (long)((*(int *)(in_RCX + (long)(local_24 * 2 + 1) * 4) >> 5) * in_ESI +
                  (*(int *)(in_RCX + (long)(local_24 << 1) * 4) >> 5));
    *(char *)((long)in_RDI + lVar1) = *(char *)((long)in_RDI + lVar1) + '\x01';
  }
  for (local_38 = 0; local_38 < in_EDX; local_38 = local_38 + 1) {
    for (local_3c = 0; local_3c < in_ESI; local_3c = local_3c + 1) {
      *(bool *)((long)in_RDI + (long)(local_38 * in_ESI + local_3c)) =
           2 < *(byte *)((long)in_RDI + (long)(local_38 * in_ESI + local_3c));
      local_20 = (uint)*(byte *)((long)in_RDI + (long)(local_38 * in_ESI + local_3c)) + local_20;
    }
  }
  if (local_20 < 0x30) {
    memset(in_RDI,1,(long)(in_ESI * in_EDX));
  }
  return;
}

Assistant:

void av1_compute_feature_segmentation_map(uint8_t *segment_map, int width,
                                          int height, int *inliers,
                                          int num_inliers) {
  int seg_count = 0;
  memset(segment_map, 0, sizeof(*segment_map) * width * height);

  for (int i = 0; i < num_inliers; i++) {
    int x = inliers[i * 2];
    int y = inliers[i * 2 + 1];
    int seg_x = x >> WARP_ERROR_BLOCK_LOG;
    int seg_y = y >> WARP_ERROR_BLOCK_LOG;
    segment_map[seg_y * width + seg_x] += 1;
  }

  for (int i = 0; i < height; i++) {
    for (int j = 0; j < width; j++) {
      uint8_t feat_count = segment_map[i * width + j];
      segment_map[i * width + j] = (feat_count >= FEAT_COUNT_TR);
      seg_count += (segment_map[i * width + j]);
    }
  }

  // If this motion does not make up a large enough portion of the frame,
  // use the unsegmented version of the error metric
  if (seg_count < SEG_COUNT_TR)
    memset(segment_map, 1, width * height * sizeof(*segment_map));
}